

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O3

void fft_convolve(fft_window_data *data,void *user)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  float *__src;
  ulong uVar4;
  long lVar5;
  long lVar6;
  size_t __n;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  
  __src = data->fft_workspace;
  uVar4 = data->framesize;
  uVar1 = *(uint *)((long)user + 0x68);
  iVar2 = *(int *)((long)user + 0x6c);
  iVar3 = *(int *)((long)user + 0x70);
  lVar5 = *(long *)((long)user + 0x78);
  lVar6 = *(long *)((long)user + 0x80);
  __n = (uVar4 & 0xffffffff) << 2;
  memcpy((void *)(lVar6 + (ulong)(uint)(iVar3 * (int)uVar4) * 4),__src,__n);
  uVar8 = 0;
  *(uint *)((long)user + 0x70) = (iVar3 + 1U) % uVar1;
  memset(__src,0,__n);
  uVar9 = iVar3 + uVar1;
  uVar7 = (ulong)(uVar1 + (uVar1 == 0));
  do {
    complex_multiply_add_resolver
              (__src,lVar6 + (ulong)((uVar9 % uVar1) * (int)uVar4) * 4,lVar5 + uVar8 * 4,
               uVar4 & 0xffffffff);
    uVar8 = (ulong)(uint)((int)uVar8 + iVar2);
    uVar9 = uVar9 - 1;
    uVar7 = uVar7 - 1;
  } while (uVar7 != 0);
  return;
}

Assistant:

VECTORIZE void fft_convolve(struct fft_window_data *data, void *user){
  struct convolution_segment_data *user_data = (struct convolution_segment_data *)user;
  uint32_t framesize = data->framesize;
  uint32_t block_size = user_data->block_size;
  uint32_t block_idx = user_data->block_idx;
  uint32_t block_count = user_data->block_count;
  float *fft_workspace = data->fft_workspace;
  float *fir = user_data->fir;
  float *buf = user_data->buf;

  // Preserve the current block
  memcpy(buf + (block_idx * framesize), fft_workspace, sizeof(float)*framesize);
  user_data->block_idx = (block_idx+1) % block_count;
  
  // Actually perform the FIR multiplication of each block in the delay line.
  memset(fft_workspace, 0, sizeof(float)*framesize);
  for(uint32_t i = 0; i < block_count; ++i){
    uint32_t buf_idx = (block_idx+block_count-i) % block_count;
    complex_multiply_add(fft_workspace, buf + (buf_idx * framesize), fir + (i * block_size), framesize);
  }
}